

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

uint8 * google::protobuf::internal::WireFormatLite::WritePrimitiveToArray<float>
                  (int field_number,RepeatedField<float> *value,
                  _func_uint8_ptr_int_float_uint8_ptr *Writer,uint8 *target)

{
  int iVar1;
  float *pfVar2;
  int local_44;
  int i;
  float *ii;
  uint8 *puStack_30;
  int n;
  uint8 *target_local;
  _func_uint8_ptr_int_float_uint8_ptr *Writer_local;
  RepeatedField<float> *value_local;
  uint8 *puStack_10;
  int field_number_local;
  
  iVar1 = RepeatedField<float>::size(value);
  puStack_10 = target;
  if (iVar1 != 0) {
    pfVar2 = RepeatedField<float>::unsafe_data(value);
    local_44 = 0;
    puStack_30 = target;
    do {
      puStack_30 = (*Writer)(field_number,pfVar2[local_44],puStack_30);
      local_44 = local_44 + 1;
      puStack_10 = puStack_30;
    } while (local_44 < iVar1);
  }
  return puStack_10;
}

Assistant:

inline uint8* WireFormatLite::WritePrimitiveToArray(
    int field_number,
    const RepeatedField<T>& value,
    uint8* (*Writer)(int, T, uint8*), uint8* target) {
  const int n = value.size();
  if (n == 0) {
    return target;
  }

  const T* ii = value.unsafe_data();
  int i = 0;
  do {
    target = Writer(field_number, ii[i], target);
  } while (++i < n);

  return target;
}